

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void compare_eq(CPUMIPSState_conflict10 *env,wr_t *pwd,wr_t *pws,wr_t *pwt,uint32_t df,int quiet,
               uintptr_t retaddr)

{
  int32_t iVar1;
  uint c_00;
  float32 fVar2;
  int iVar3;
  int iVar4;
  float_status *pfVar5;
  float64 fVar6;
  int64_t iVar7;
  int64_t cond_1;
  int c_1;
  float_status *status_1;
  int64_t cond;
  int c;
  float_status *status;
  uint32_t i;
  wr_t *pwx;
  wr_t wx;
  int quiet_local;
  uint32_t df_local;
  wr_t *pwt_local;
  wr_t *pws_local;
  wr_t *pwd_local;
  CPUMIPSState_conflict10 *env_local;
  
  wx.w[2] = quiet;
  wx.w[3] = df;
  _quiet_local = pwt;
  pwt_local = pws;
  pws_local = pwd;
  pwd_local = (wr_t *)env;
  clear_msacsr_cause(env);
  if (wx.w[3] == 2) {
    for (status._4_4_ = 0; status._4_4_ < 4; status._4_4_ = status._4_4_ + 1) {
      pfVar5 = (float_status *)((long)pwd_local + 0x1ac);
      set_float_exception_flags(0,pfVar5);
      if (wx.w[2] == 0) {
        iVar3 = float32_eq_mips64el(pwt_local->w[status._4_4_],_quiet_local->w[status._4_4_],pfVar5)
        ;
      }
      else {
        iVar3 = float32_eq_quiet_mips64el
                          (pwt_local->w[status._4_4_],_quiet_local->w[status._4_4_],pfVar5);
      }
      status_1 = (float_status *)(long)iVar3;
      iVar1 = 0;
      if (status_1 != (float_status *)0x0) {
        iVar1 = -1;
      }
      ((wr_t *)&pwx)->w[status._4_4_] = iVar1;
      c_00 = update_msacsr((CPUMIPSState_conflict10 *)pwd_local,2,0);
      iVar3 = get_enabled_exceptions((CPUMIPSState_conflict10 *)pwd_local,c_00);
      if (iVar3 != 0) {
        fVar2 = float32_default_nan_mips64el(pfVar5);
        ((wr_t *)&pwx)->w[status._4_4_] = (fVar2 ^ 0x400020) & 0xffffffc0 | c_00;
      }
    }
  }
  else {
    if (wx.w[3] != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x16d2,
                    "void compare_eq(CPUMIPSState *, wr_t *, wr_t *, wr_t *, uint32_t, int, uintptr_t)"
                   );
    }
    for (status._4_4_ = 0; status._4_4_ < 2; status._4_4_ = status._4_4_ + 1) {
      pfVar5 = (float_status *)((long)pwd_local + 0x1ac);
      set_float_exception_flags(0,pfVar5);
      if (wx.w[2] == 0) {
        iVar3 = float64_eq_mips64el(pwt_local->d[status._4_4_],_quiet_local->d[status._4_4_],pfVar5)
        ;
      }
      else {
        iVar3 = float64_eq_quiet_mips64el
                          (pwt_local->d[status._4_4_],_quiet_local->d[status._4_4_],pfVar5);
      }
      iVar7 = 0;
      if (iVar3 != 0) {
        iVar7 = -1;
      }
      ((wr_t *)&pwx)->d[status._4_4_] = iVar7;
      iVar3 = update_msacsr((CPUMIPSState_conflict10 *)pwd_local,2,0);
      iVar4 = get_enabled_exceptions((CPUMIPSState_conflict10 *)pwd_local,iVar3);
      if (iVar4 != 0) {
        fVar6 = float64_default_nan_mips64el(pfVar5);
        ((wr_t *)&pwx)->d[status._4_4_] =
             (fVar6 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar3;
      }
    }
  }
  check_msacsr_cause((CPUMIPSState_conflict10 *)pwd_local,retaddr);
  msa_move_v(pws_local,(wr_t *)&pwx);
  return;
}

Assistant:

static inline void compare_eq(CPUMIPSState *env, wr_t *pwd, wr_t *pws,
                              wr_t *pwt, uint32_t df, int quiet,
                              uintptr_t retaddr)
{
    wr_t wx, *pwx = &wx;
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_COND(pwx->w[i], eq, pws->w[i], pwt->w[i], 32, quiet);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_COND(pwx->d[i], eq, pws->d[i], pwt->d[i], 64, quiet);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, retaddr);

    msa_move_v(pwd, pwx);
}